

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qft.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  QObject<std::complex<double>_> *pQVar2;
  pointer puVar3;
  undefined1 auVar4 [8];
  int iVar5;
  int *piVar6;
  long *plVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  pointer puVar11;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> circuit;
  stringstream qasm;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> local_208;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [8];
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> local_1b0;
  _func_int *local_1a8 [14];
  ios_base local_138 [264];
  
  lVar9 = 2;
  if (argc < 2) {
LAB_001066be:
    lVar10 = 5;
    if (argc < 3) {
LAB_0010674f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nb qubits = ",0xc);
      iVar5 = (int)lVar9;
      plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      local_208.super_QAdjustable.fixed_ = false;
      local_208.super_QObject<std::complex<double>_>._vptr_QObject =
           (_func_int **)&PTR_nbQubits_00125918;
      local_208.offset_ = 0;
      local_208.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.nbQubits_ = iVar5;
      if (iVar5 < 1) {
        __assert_fail("nbQubits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                      ,0x34,
                      "qclab::QCircuit<std::complex<double>>::QCircuit(const int) [T = std::complex<double>, G = qclab::QObject<std::complex<double>>]"
                     );
      }
      qft<std::complex<double>>(&local_208);
      if (iVar5 <= (int)lVar10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nmatrix =",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::matrix
                  ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                   local_1b8);
        qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
                  ((SquareMatrix<std::complex<double>_> *)local_1b8);
        if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
            local_1b0._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
            (complex<double> *)0x0) {
          operator_delete__((void *)local_1b0._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl);
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      if (local_208.gates_.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.gates_.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar3 = local_208.gates_.
                 super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          puVar11 = puVar3 + 1;
          pQVar2 = (puVar3->_M_t).
                   super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>.
                   _M_head_impl;
          iVar5 = (*pQVar2->_vptr_QObject[0xb])(pQVar2,local_1a8,(ulong)(uint)local_208.offset_);
          if (iVar5 != 0) break;
          puVar3 = puVar11;
        } while (puVar11 !=
                 local_208.gates_.
                 super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nqasm:\n",7);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      local_208.super_QObject<std::complex<double>_>._vptr_QObject =
           (_func_int **)&PTR_nbQubits_00125918;
      std::
      vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ::~vector(&local_208.gates_);
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,argv[2],(allocator<char> *)&local_1d8);
    auVar4 = local_1b8;
    argv = (char **)__errno_location();
    iVar5 = *(int *)&(((vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                        *)argv)->
                     super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
    *(int *)&(((vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                *)argv)->
             super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start = 0;
    lVar10 = strtol((char *)auVar4,(char **)&local_208,10);
    if ((undefined1  [8])local_208.super_QObject<std::complex<double>_>._vptr_QObject != auVar4) {
      if (((int)lVar10 == lVar10) &&
         (iVar1 = *(int *)&(((vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                              *)argv)->
                           super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start, iVar1 != 0x22)) {
        if (iVar1 == 0) {
          *(int *)&(((vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                      *)argv)->
                   super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start = iVar5;
        }
        if (local_1b8 != (undefined1  [8])local_1a8) {
          operator_delete((void *)local_1b8,(ulong)(local_1a8[0] + 1));
        }
        goto LAB_0010674f;
      }
      goto LAB_00106975;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,argv[1],(allocator<char> *)&local_1d8);
    auVar4 = local_1b8;
    piVar6 = __errno_location();
    iVar5 = *piVar6;
    *piVar6 = 0;
    lVar9 = strtol((char *)auVar4,(char **)&local_208,10);
    if ((undefined1  [8])local_208.super_QObject<std::complex<double>_>._vptr_QObject == auVar4) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar9 == lVar9) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar5;
      }
      if (local_1b8 != (undefined1  [8])local_1a8) {
        operator_delete((void *)local_1b8,(ulong)(local_1a8[0] + 1));
      }
      goto LAB_001066be;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_00106975:
  uVar8 = std::__throw_out_of_range("stoi");
  if (local_1b0._M_t.
      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_1b0._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1b0._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0;
  std::
  vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  ::~vector((vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
             *)argv);
  _Unwind_Resume(uVar8);
}

Assistant:

int main( int argc , char *argv[] ) {

  using T = std::complex< double > ;

  // defaults
  int nbQubits = 2 ;
  int maxPrint = 5 ;

  // arguments
  if ( argc > 1 ) nbQubits = std::stoi( argv[1] ) ;
  if ( argc > 2 ) maxPrint = std::stoi( argv[2] ) ;
  std::cout << "nb qubits = " << nbQubits << std::endl ;

  // quantum circuit
  qclab::QCircuit< T > circuit( nbQubits ) ;

  // qft
  qft( circuit ) ;

  // print matrix
  if ( nbQubits <= maxPrint ) {
    std::cout << "\nmatrix =" << std::endl ;
    qclab::printMatrix( circuit.matrix() ) ;
  }

  // print qasm
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() ;

  // successful
  return 0 ;

}